

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O2

void anon_unknown.dwarf_4d3168::convert_timeseries_option
               (Options *opts,char *ts_opt_name,string *target)

{
  bool bVar1;
  string spot_opt_name;
  string local_60;
  char *local_40 [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"timeseries.",(allocator<char> *)&local_60);
  std::__cxx11::string::append((char *)local_40);
  bVar1 = cali::ConfigManager::Options::is_set(opts,local_40[0]);
  if (bVar1) {
    if (target->_M_string_length != 0) {
      std::__cxx11::string::append((char *)target);
    }
    std::__cxx11::string::append((char *)target);
    std::__cxx11::string::append((char *)target);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_60,opts,local_40[0],"");
    std::__cxx11::string::append((string *)target);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void convert_timeseries_option(const ConfigManager::Options& opts, const char* ts_opt_name, std::string& target)
{
    std::string spot_opt_name = "timeseries.";
    spot_opt_name.append(ts_opt_name);

    if (opts.is_set(spot_opt_name.c_str())) {
        if (!target.empty())
            target.append(",");

        target.append(ts_opt_name);
        target.append("=");
        target.append(opts.get(spot_opt_name.c_str()));
    }
}